

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O3

void re2c::emit_action(Action *action,OutputFile *o,uint32_t ind,bool *readCh,State *s,
                      string *condName,Skeleton *skeleton,
                      set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                      *used_labels,bool save_yyaccept)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  Initial *__k;
  pointer ppSVar3;
  pointer ppSVar4;
  RuleOp *pRVar5;
  size_t __n;
  pointer pcVar6;
  int iVar7;
  const_iterator cVar8;
  OutputFile *pOVar9;
  opt_t *poVar10;
  Code *pCVar11;
  opt_t *poVar12;
  size_t n;
  undefined1 *puVar13;
  State *value;
  undefined1 *puVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  accept_t *accepts;
  uint uVar17;
  bool bVar18;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  State *local_a0;
  accept_t *local_98;
  undefined1 *local_90;
  long *local_88 [2];
  long local_78 [2];
  uint32_t local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  realopt_t *local_38;
  
  switch(action->type) {
  case MATCH:
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar12->target == DOT) break;
    if (s == (State *)0x0) {
      bVar18 = false;
    }
    else if (s->next == (State *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = (s->next->action).type != RULE;
    }
    if (s->fill == 0) {
      if (bVar18) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = false;
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = true;
      }
    }
    else {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    n = s->fill;
    if (n == 0) break;
    goto LAB_0011b0bd;
  case INITIAL:
    __k = (action->info).initial;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar12->target == DOT) break;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)readCh;
    cVar8 = std::
            _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
            ::find(&used_labels->_M_t,&s->label);
    p_Var1 = &(used_labels->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
      if (s->fill == 0) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_skip_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    cVar8 = std::
            _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
            ::find(&used_labels->_M_t,&__k->label);
    if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar9 = OutputFile::wstring(o,&poVar12->labelPrefix);
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)(__k->label).value);
      OutputFile::ws(pOVar9,":\n");
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar12->dFlag == true) {
      pOVar9 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yydebug);
      pOVar9 = OutputFile::ws(pOVar9,"(");
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)(__k->label).value);
      pOVar9 = OutputFile::ws(pOVar9,", *");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yycursor);
      OutputFile::ws(pOVar9,");\n");
    }
    pbVar15 = local_a8;
    n = s->fill;
    bVar18 = __k->setMarker;
    readCh = (bool *)local_a8;
    if (n == 0) {
      if (bVar18 != false) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_backup_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      *(bool *)&(pbVar15->_M_dataplus)._M_p = false;
      break;
    }
    goto LAB_0011b0c0;
  case SAVE:
    uVar2 = (action->info).save;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar12->target == DOT) break;
    if (save_yyaccept) {
      pOVar9 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
      pOVar9 = OutputFile::ws(pOVar9," = ");
      pOVar9 = OutputFile::wu32(pOVar9,uVar2);
      OutputFile::ws(pOVar9,";\n");
    }
    if (s->fill == 0) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      InputAPI::stmt_skip_backup_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      *readCh = false;
      break;
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    InputAPI::stmt_skip_backup_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    n = s->fill;
LAB_0011b0bd:
    bVar18 = false;
LAB_0011b0c0:
    need(o,ind,readCh,n,bVar18);
    break;
  case ACCEPT:
    accepts = (action->info).accepts;
    ppSVar3 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar4 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar3 != ppSVar4) {
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)ppSVar3 - (long)ppSVar4);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if (poVar12->target != DOT) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_restore_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if (*readCh == true) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_peek_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        *readCh = false;
      }
      if ((long)ppSVar3 - (long)ppSVar4 == 8) {
        genGoTo(o,ind,s,*(accepts->elems).
                         super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,readCh);
      }
      else {
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_a8 >> 3);
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        if ((poVar12->gFlag == true) &&
           (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868),
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)poVar12->cGotoThreshold <= local_a8)) {
          local_a0 = s;
          pOVar9 = OutputFile::wind(o,ind);
          OutputFile::ws(pOVar9,"{\n");
          local_90 = (undefined1 *)CONCAT44(local_90._4_4_,ind + 2);
          local_64 = ind + 1;
          local_40 = (ulong)ind;
          pOVar9 = OutputFile::wind(o,ind + 1);
          pOVar9 = OutputFile::ws(pOVar9,"static void *");
          local_38 = (realopt_t *)&DAT_0015c868;
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yytarget);
          pOVar9 = OutputFile::ws(pOVar9,"[");
          pbVar15 = local_a8;
          pOVar9 = OutputFile::wu64(pOVar9,(uint64_t)local_a8);
          OutputFile::ws(pOVar9,"] = {\n");
          uVar17 = 1;
          pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          do {
            pOVar9 = OutputFile::wind(o,(uint32_t)local_90);
            pOVar9 = OutputFile::ws(pOVar9,"&&");
            poVar12 = realopt_t::operator->(local_38);
            pOVar9 = OutputFile::wstring(pOVar9,&poVar12->labelPrefix);
            pOVar9 = OutputFile::wlabel(pOVar9,(label_t)((accepts->elems).
                                                                                                                  
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)pbVar16]->label).value);
            OutputFile::ws(pOVar9,",\n");
            uVar2 = local_64;
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (ulong)uVar17;
            uVar17 = uVar17 + 1;
          } while (pbVar16 < pbVar15);
          pOVar9 = OutputFile::wind(o,local_64);
          OutputFile::ws(pOVar9,"};\n");
          pOVar9 = OutputFile::wind(o,uVar2);
          pOVar9 = OutputFile::ws(pOVar9,"goto *");
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yytarget);
          pOVar9 = OutputFile::ws(pOVar9,"[");
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
          OutputFile::ws(pOVar9,"];\n");
          ind = (uint32_t)local_40;
          pOVar9 = OutputFile::wind(o,ind);
          OutputFile::ws(pOVar9,"}\n");
          s = local_a0;
        }
        else {
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          if ((poVar12->sFlag == false) &&
             (((long)ppSVar3 - (long)ppSVar4 != 0x10 ||
              (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar12->target == DOT))
             )) {
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
            if (poVar12->target == DOT) {
              uVar17 = 1;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_98 = accepts;
              do {
                pOVar9 = OutputFile::wlabel(o,(label_t)(s->label).value);
                pOVar9 = OutputFile::ws(pOVar9," -> ");
                OutputFile::wlabel(pOVar9,(label_t)((local_98->elems).
                                                                                                        
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)pbVar15]->label).value);
                pOVar9 = OutputFile::ws(o," [label=\"yyaccept=");
                pOVar9 = OutputFile::wu32(pOVar9,uVar17 - 1);
                OutputFile::ws(pOVar9,"\"]\n");
                pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ulong)uVar17;
                uVar17 = uVar17 + 1;
              } while (pbVar15 < local_a8);
            }
            else {
              pOVar9 = OutputFile::wind(o,ind);
              pOVar9 = OutputFile::ws(pOVar9,"switch (");
              poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
              pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
              OutputFile::ws(pOVar9,") {\n");
              puVar13 = (undefined1 *)((long)&local_a8[-1].field_2 + 0xf);
              local_a0 = s;
              if (puVar13 != (undefined1 *)0x0) {
                uVar17 = 1;
                puVar14 = (undefined1 *)0x0;
                local_98 = accepts;
                local_90 = puVar13;
                do {
                  pOVar9 = OutputFile::wind(o,ind);
                  pOVar9 = OutputFile::ws(pOVar9,"case ");
                  accepts = local_98;
                  pOVar9 = OutputFile::wu32(pOVar9,uVar17 - 1);
                  OutputFile::ws(pOVar9,": \t");
                  genGoTo(o,0,local_a0,
                          (accepts->elems).
                          super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)puVar14],readCh);
                  puVar14 = (undefined1 *)(ulong)uVar17;
                  uVar17 = uVar17 + 1;
                } while (puVar14 < local_90);
              }
              pOVar9 = OutputFile::wind(o,ind);
              OutputFile::ws(pOVar9,"default:\t");
              s = local_a0;
              genGoTo(o,0,local_a0,
                      (accepts->elems).
                      super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [(long)((long)&local_a8[-1].field_2._M_allocated_capacity + 0xf)],readCh);
              pOVar9 = OutputFile::wind(o,ind);
              OutputFile::ws(pOVar9,"}\n");
            }
          }
          else {
            emit_accept_binary(o,ind,readCh,s,accepts,0,(size_t)((long)&local_a8[-1].field_2 + 0xf))
            ;
          }
        }
      }
    }
    break;
  case RULE:
    pRVar5 = (action->info).rule;
    value = s;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar12->target == DOT) {
      OutputFile::wlabel(o,(label_t)(s->label).value);
      if (pRVar5->code != (Code *)0x0) {
        pOVar9 = OutputFile::ws(o," [label=\"");
        pOVar9 = OutputFile::wstring(pOVar9,(string *)pRVar5->code);
        pOVar9 = OutputFile::ws(pOVar9,":");
        pOVar9 = OutputFile::wu32(pOVar9,(pRVar5->code->loc).line);
        OutputFile::ws(pOVar9,"\"]");
      }
      OutputFile::ws(o,"\n");
    }
    else {
      iVar7 = (*pRVar5->ctx->_vptr_RegExp[4])();
      if ((iVar7 != 0) &&
         (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar12->target != DOT)) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_restorectx_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if (poVar12->target == SKELETON) {
        Skeleton::emit_action(skeleton,o,ind,(rule_rank_t)(pRVar5->rank).value);
      }
      else {
        local_a8 = &pRVar5->newcond;
        __n = (pRVar5->newcond)._M_string_length;
        if ((__n != 0) &&
           ((condName->_M_string_length != __n ||
            (iVar7 = bcmp((condName->_M_dataplus)._M_p,(local_a8->_M_dataplus)._M_p,__n), iVar7 != 0
            )))) {
          pOVar9 = OutputFile::wind(o,ind);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          local_88[0] = local_78;
          pcVar6 = (poVar12->cond_set)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,pcVar6,pcVar6 + (poVar12->cond_set)._M_string_length);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          poVar10 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          std::operator+(&local_60,&poVar10->condEnumPrefix,local_a8);
          replaceParam<std::__cxx11::string>
                    (&local_c8,(re2c *)local_88,&poVar12->cond_set_arg,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
          OutputFile::wstring(pOVar9,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if (local_88[0] != local_78) {
            operator_delete(local_88[0],local_78[0] + 1);
          }
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          if (poVar12->cond_set_naked == false) {
            pOVar9 = OutputFile::ws(o,"(");
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
            pOVar9 = OutputFile::wstring(pOVar9,&poVar12->condEnumPrefix);
            pOVar9 = OutputFile::wstring(pOVar9,local_a8);
            OutputFile::ws(pOVar9,");");
          }
          OutputFile::ws(o,"\n");
        }
        pCVar11 = pRVar5->code;
        if (pCVar11 == (Code *)0x0) {
          if ((pRVar5->newcond)._M_string_length != 0) {
            pOVar9 = OutputFile::wind(o,ind);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
            pcVar6 = (poVar12->condGoto)._M_dataplus._M_p;
            local_88[0] = local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_88,pcVar6,pcVar6 + (poVar12->condGoto)._M_string_length);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
            poVar10 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
            std::operator+(&local_60,&poVar10->condPrefix,local_a8);
            replaceParam<std::__cxx11::string>
                      (&local_c8,(re2c *)local_88,&poVar12->condGotoParam,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
            pOVar9 = OutputFile::wstring(pOVar9,&local_c8);
            OutputFile::ws(pOVar9,"\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_88[0] != local_78) {
              operator_delete(local_88[0],local_78[0] + 1);
            }
          }
        }
        else {
          if (yySetupRule_abi_cxx11_._8_8_ != 0) {
            pOVar9 = OutputFile::wind(o,ind);
            pOVar9 = OutputFile::wstring(pOVar9,(string *)yySetupRule_abi_cxx11_);
            OutputFile::ws(pOVar9,"\n");
            pCVar11 = pRVar5->code;
          }
          pOVar9 = OutputFile::wline_info
                             (o,(pCVar11->loc).line,(pCVar11->loc).filename._M_dataplus._M_p);
          pOVar9 = OutputFile::wind(pOVar9,ind);
          pOVar9 = OutputFile::wstring(pOVar9,&pRVar5->code->text);
          pOVar9 = OutputFile::ws(pOVar9,"\n");
          OutputFile::wdelay_line_info(pOVar9);
        }
      }
    }
  }
  if ((s->isPreCtxt == true) &&
     (poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar12->target != DOT)) {
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    InputAPI::stmt_backupctx_abi_cxx11_(&local_c8,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void emit_action
	( const Action & action
	, OutputFile & o
	, uint32_t ind
	, bool & readCh
	, const State * const s
	, const std::string & condName
	, const Skeleton * skeleton
	, const std::set<label_t> & used_labels
	, bool save_yyaccept
	)
{
	switch (action.type)
	{
		case Action::MATCH:
			emit_match (o, ind, readCh, s);
			break;
		case Action::INITIAL:
			emit_initial (o, ind, readCh, s, * action.info.initial, used_labels);
			break;
		case Action::SAVE:
			emit_save (o, ind, readCh, s, action.info.save, save_yyaccept);
			break;
		case Action::MOVE:
			break;
		case Action::ACCEPT:
			emit_accept (o, ind, readCh, s, * action.info.accepts);
			break;
		case Action::RULE:
			emit_rule (o, ind, s, action.info.rule, condName, skeleton);
			break;
	}
	if (s->isPreCtxt && opts->target != opt_t::DOT)
	{
		o.wstring(opts->input_api.stmt_backupctx (ind));
	}
}